

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

int32 fe_build_melfilters(melfb_t *mel_fb)

{
  short sVar1;
  int16 *piVar2;
  bool bVar3;
  int16 *piVar4;
  mfcc_t *pmVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t size;
  long lVar9;
  int32 iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float32 freqs [3];
  float local_44;
  float local_3c [3];
  double local_30;
  
  piVar4 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x231);
  mel_fb->spec_start = piVar4;
  piVar4 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x233);
  mel_fb->filt_start = piVar4;
  piVar4 = (int16 *)__ckd_calloc__((long)mel_fb->num_filters,2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                                   ,0x235);
  mel_fb->filt_width = piVar4;
  fVar12 = fe_warp_unwarped_to_warped(mel_fb,(float)mel_fb->lower_filt_freq);
  dVar14 = log10((double)fVar12 / 700.0 + 1.0);
  local_44 = (float)(dVar14 * 2595.0);
  fVar12 = fe_warp_unwarped_to_warped(mel_fb,(float)mel_fb->upper_filt_freq);
  dVar14 = log10((double)fVar12 / 700.0 + 1.0);
  fVar12 = ((float)(dVar14 * 2595.0) - local_44) / (float)(mel_fb->num_filters + 1);
  if (mel_fb->doublewide == 0) {
LAB_001101c8:
    fVar13 = (float)mel_fb->sampling_rate / (float)mel_fb->fft_size;
    iVar10 = 0;
    if (mel_fb->num_filters < 1) {
      size = 0;
    }
    else {
      lVar11 = 0;
      iVar8 = 0;
      do {
        lVar9 = 0;
        do {
          dVar14 = pow(10.0,(double)((float)(((int)lVar9 << (mel_fb->doublewide != 0)) + (int)lVar11
                                            ) * fVar12 + local_44) / 2595.0);
          fVar15 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar14 + -1.0) * 700.0));
          local_3c[lVar9] = fVar15;
          if (mel_fb->round_filters != 0) {
            local_3c[lVar9] = (float)(int)(local_3c[lVar9] / fVar13 + 0.5) * fVar13;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        piVar4 = mel_fb->spec_start;
        piVar4[lVar11] = -1;
        if (-2 < mel_fb->fft_size) {
          iVar6 = mel_fb->fft_size / 2;
          iVar7 = 0;
          do {
            if ((float)iVar7 * fVar13 < local_3c[0]) {
LAB_001102fc:
              bVar3 = false;
            }
            else {
              if ((iVar6 != iVar7) && ((float)iVar7 * fVar13 <= local_3c[2])) {
                if (piVar4[lVar11] == -1) {
                  piVar4[lVar11] = (short)iVar7;
                }
                goto LAB_001102fc;
              }
              piVar2 = mel_fb->filt_width;
              piVar2[lVar11] = (short)iVar7 - piVar4[lVar11];
              mel_fb->filt_start[lVar11] = (int16)iVar8;
              iVar8 = iVar8 + piVar2[lVar11];
              bVar3 = true;
            }
            if (bVar3) break;
            bVar3 = iVar7 < iVar6;
            iVar7 = iVar7 + 1;
          } while (bVar3);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < mel_fb->num_filters);
      size = (long)iVar8 << 2;
    }
    pmVar5 = (mfcc_t *)
             __ckd_malloc__(size,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                            ,0x276);
    mel_fb->filt_coeffs = pmVar5;
    if (0 < mel_fb->num_filters) {
      lVar11 = 0;
      iVar8 = 0;
      do {
        lVar9 = 0;
        do {
          dVar14 = pow(10.0,(double)((float)(((int)lVar9 << (mel_fb->doublewide != 0)) + (int)lVar11
                                            ) * fVar12 + local_44) / 2595.0);
          fVar15 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar14 + -1.0) * 700.0));
          local_3c[lVar9] = fVar15;
          if (mel_fb->round_filters != 0) {
            local_3c[lVar9] = (float)(int)(local_3c[lVar9] / fVar13 + 0.5) * fVar13;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        sVar1 = mel_fb->filt_width[lVar11];
        if (0 < sVar1) {
          iVar7 = (int)mel_fb->spec_start[lVar11];
          fVar15 = 2.0 / (local_3c[2] - local_3c[0]);
          lVar9 = (long)iVar8;
          iVar6 = 0;
          do {
            fVar16 = (float)iVar7 * fVar13;
            if ((fVar16 < local_3c[0]) || (local_3c[2] < fVar16)) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                      ,0x291,
                      "Failed to create filterbank, frequency range does not match. Sample rate %f, FFT size %d, lowerf %f < freq %f > upperf %f.\n"
                      ,(double)(float)mel_fb->sampling_rate,(double)local_3c[0],(double)fVar16,
                      (double)local_3c[2],(ulong)(uint)mel_fb->fft_size);
              exit(1);
            }
            fVar17 = (fVar16 - local_3c[0]) / (local_3c[1] - local_3c[0]);
            fVar16 = (local_3c[2] - fVar16) / (local_3c[2] - local_3c[1]);
            if (mel_fb->unit_area != 0) {
              fVar17 = fVar17 * fVar15;
              fVar16 = fVar16 * fVar15;
            }
            if (fVar16 <= fVar17) {
              fVar17 = fVar16;
            }
            mel_fb->filt_coeffs[lVar9] = (mfcc_t)fVar17;
            lVar9 = lVar9 + 1;
            iVar6 = iVar6 + -1;
            iVar7 = iVar7 + 1;
          } while (-(int)sVar1 != iVar6);
          iVar8 = iVar8 - iVar6;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < mel_fb->num_filters);
      iVar10 = 0;
    }
  }
  else {
    local_44 = local_44 - fVar12;
    fVar15 = (float)(dVar14 * 2595.0) + fVar12;
    local_30 = (double)local_44 / 2595.0;
    dVar14 = pow(10.0,local_30);
    fVar13 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar14 + -1.0) * 700.0));
    if (0.0 <= fVar13) {
      dVar14 = pow(10.0,(double)fVar15 / 2595.0);
      fVar13 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar14 + -1.0) * 700.0));
      if (fVar13 <= (float)mel_fb->sampling_rate * 0.5) goto LAB_001101c8;
    }
    dVar14 = pow(10.0,local_30);
    fVar12 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar14 + -1.0) * 700.0));
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
            ,0x245,"Out of Range: low  filter edge = %f (%f)\n",(double)fVar12,0);
    dVar14 = pow(10.0,(double)fVar15 / 2595.0);
    fVar12 = fe_warp_warped_to_unwarped(mel_fb,(float)((dVar14 + -1.0) * 700.0));
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
            ,0x248,"              high filter edge = %f (%f)\n",(double)fVar12,
            (double)((float)mel_fb->sampling_rate * 0.5));
    iVar10 = -10;
  }
  return iVar10;
}

Assistant:

int32
fe_build_melfilters(melfb_t * mel_fb)
{
    float32 melmin, melmax, melbw, fftfreq;
    int n_coeffs, i, j;


    /* Filter coefficient matrix, in flattened form. */
    mel_fb->spec_start =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->spec_start));
    mel_fb->filt_start =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->filt_start));
    mel_fb->filt_width =
        ckd_calloc(mel_fb->num_filters, sizeof(*mel_fb->filt_width));

    /* First calculate the widths of each filter. */
    /* Minimum and maximum frequencies in mel scale. */
    melmin = fe_mel(mel_fb, mel_fb->lower_filt_freq);
    melmax = fe_mel(mel_fb, mel_fb->upper_filt_freq);

    /* Width of filters in mel scale */
    melbw = (melmax - melmin) / (mel_fb->num_filters + 1);
    if (mel_fb->doublewide) {
        melmin -= melbw;
        melmax += melbw;
        if ((fe_melinv(mel_fb, melmin) < 0) ||
            (fe_melinv(mel_fb, melmax) > mel_fb->sampling_rate / 2)) {
            E_WARN
                ("Out of Range: low  filter edge = %f (%f)\n",
                 fe_melinv(mel_fb, melmin), 0.0);
            E_WARN
                ("              high filter edge = %f (%f)\n",
                 fe_melinv(mel_fb, melmax), mel_fb->sampling_rate / 2);
            return FE_INVALID_PARAM_ERROR;
        }
    }

    /* DFT point spacing */
    fftfreq = mel_fb->sampling_rate / (float32) mel_fb->fft_size;

    /* Count and place filter coefficients. */
    n_coeffs = 0;
    for (i = 0; i < mel_fb->num_filters; ++i) {
        float32 freqs[3];

        /* Left, center, right frequencies in Hertz */
        for (j = 0; j < 3; ++j) {
            if (mel_fb->doublewide)
                freqs[j] = fe_melinv(mel_fb, (i + j * 2) * melbw + melmin);
            else
                freqs[j] = fe_melinv(mel_fb, (i + j) * melbw + melmin);
            /* Round them to DFT points if requested */
            if (mel_fb->round_filters)
                freqs[j] = ((int) (freqs[j] / fftfreq + 0.5)) * fftfreq;
        }

        /* spec_start is the start of this filter in the power spectrum. */
        mel_fb->spec_start[i] = -1;
        /* There must be a better way... */
        for (j = 0; j < mel_fb->fft_size / 2 + 1; ++j) {
            float32 hz = j * fftfreq;
            if (hz < freqs[0])
                continue;
            else if (hz > freqs[2] || j == mel_fb->fft_size / 2) {
                /* filt_width is the width in DFT points of this filter. */
                mel_fb->filt_width[i] = j - mel_fb->spec_start[i];
                /* filt_start is the start of this filter in the filt_coeffs array. */
                mel_fb->filt_start[i] = n_coeffs;
                n_coeffs += mel_fb->filt_width[i];
                break;
            }
            if (mel_fb->spec_start[i] == -1)
                mel_fb->spec_start[i] = j;
        }
    }

    /* Now go back and allocate the coefficient array. */
    mel_fb->filt_coeffs =
        ckd_malloc(n_coeffs * sizeof(*mel_fb->filt_coeffs));

    /* And now generate the coefficients. */
    n_coeffs = 0;
    for (i = 0; i < mel_fb->num_filters; ++i) {
        float32 freqs[3];

        /* Left, center, right frequencies in Hertz */
        for (j = 0; j < 3; ++j) {
            if (mel_fb->doublewide)
                freqs[j] = fe_melinv(mel_fb, (i + j * 2) * melbw + melmin);
            else
                freqs[j] = fe_melinv(mel_fb, (i + j) * melbw + melmin);
            /* Round them to DFT points if requested */
            if (mel_fb->round_filters)
                freqs[j] = ((int) (freqs[j] / fftfreq + 0.5)) * fftfreq;
        }

        for (j = 0; j < mel_fb->filt_width[i]; ++j) {
            float32 hz, loslope, hislope;

            hz = (mel_fb->spec_start[i] + j) * fftfreq;
            if (hz < freqs[0] || hz > freqs[2]) {
                E_FATAL
                    ("Failed to create filterbank, frequency range does not match. "
                     "Sample rate %f, FFT size %d, lowerf %f < freq %f > upperf %f.\n",
                     mel_fb->sampling_rate, mel_fb->fft_size, freqs[0], hz,
                     freqs[2]);
            }
            loslope = (hz - freqs[0]) / (freqs[1] - freqs[0]);
            hislope = (freqs[2] - hz) / (freqs[2] - freqs[1]);
            if (mel_fb->unit_area) {
                loslope *= 2 / (freqs[2] - freqs[0]);
                hislope *= 2 / (freqs[2] - freqs[0]);
            }
            if (loslope < hislope) {
#ifdef FIXED_POINT
                mel_fb->filt_coeffs[n_coeffs] = fe_log(loslope);
#else
                mel_fb->filt_coeffs[n_coeffs] = loslope;
#endif
            }
            else {
#ifdef FIXED_POINT
                mel_fb->filt_coeffs[n_coeffs] = fe_log(hislope);
#else
                mel_fb->filt_coeffs[n_coeffs] = hislope;
#endif
            }
            ++n_coeffs;
        }
    }

    return FE_SUCCESS;
}